

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlatin1stringmatcher.cpp
# Opt level: O2

qsizetype __thiscall
QLatin1StringMatcher::indexIn_helper<QStringView>
          (QLatin1StringMatcher *this,QStringView haystack,qsizetype from)

{
  char16_t *last;
  long lVar1;
  char *pat_first;
  bool bVar2;
  char16_t *pcVar3;
  ulong uVar4;
  storage_type_conflict *psVar5;
  long lVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  QLatin1StringView s;
  R_conflict12 RVar8;
  QStringView local_48;
  long local_38;
  
  psVar5 = haystack.m_data;
  uVar7 = haystack.m_size;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = (this->m_pattern).m_size;
  uVar4 = uVar7;
  if (uVar7 != from || lVar1 != 0) {
    lVar6 = (from >> 0x3f & uVar7) + from;
    uVar4 = 0xffffffffffffffff;
    if (lVar6 < (long)uVar7) {
      pcVar3 = psVar5 + lVar6;
      last = psVar5 + uVar7;
      pat_first = (this->m_pattern).m_data;
      if (this->m_cs == CaseSensitive) {
        RVar8 = QtPrivate::
                q_boyer_moore_searcher_hashed_needle<char_const*,QtPrivate::QCaseSensitiveLatin1Hash,std::equal_to<void>>
                ::operator()((q_boyer_moore_searcher_hashed_needle<char_const*,QtPrivate::QCaseSensitiveLatin1Hash,std::equal_to<void>>
                              *)&(this->field_2).m_caseSensitiveSearcher,pcVar3,last,pat_first,
                             pat_first + lVar1);
        pcVar3 = RVar8.begin;
        uVar4 = 0xffffffffffffffff;
        if (pcVar3 != last) {
LAB_002d6d55:
          uVar4 = (long)pcVar3 - (long)psVar5 >> 1;
        }
      }
      else {
        lVar6 = 0x100;
        if (lVar1 < 0x100) {
          lVar6 = lVar1;
        }
        local_48.m_size = uVar7;
        local_48.m_data = psVar5;
        while( true ) {
          RVar8 = QtPrivate::
                  q_boyer_moore_searcher_hashed_needle<char_const*,QtPrivate::QCaseInsensitiveLatin1Hash,std::equal_to<void>>
                  ::operator()((q_boyer_moore_searcher_hashed_needle<char_const*,QtPrivate::QCaseInsensitiveLatin1Hash,std::equal_to<void>>
                                *)&(this->field_2).m_caseSensitiveSearcher,pcVar3,last,
                               this->m_foldBuffer,this->m_foldBuffer + lVar6);
          pcVar3 = RVar8.begin;
          if (pcVar3 == last) break;
          if (lVar1 - lVar6 < 1) goto LAB_002d6d55;
          local_48.m_size = ((long)pcVar3 - (long)psVar5 >> 1) + lVar6;
          if ((long)uVar7 <= local_48.m_size) {
            local_48.m_size = uVar7;
          }
          local_48.m_data = psVar5 + local_48.m_size;
          local_48.m_size = uVar7 - local_48.m_size;
          s.m_data = pat_first + lVar6;
          s.m_size = lVar1 - lVar6;
          bVar2 = QStringView::startsWith(&local_48,s,CaseInsensitive);
          if (bVar2) goto LAB_002d6d55;
          pcVar3 = pcVar3 + 1;
        }
        uVar4 = 0xffffffffffffffff;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return uVar4;
}

Assistant:

qsizetype QLatin1StringMatcher::indexIn_helper(String haystack, qsizetype from) const noexcept
{
    static_assert(QtPrivate::isLatin1OrUtf16View<String>);

    if (m_pattern.isEmpty() && from == haystack.size())
        return from;
    if (from < 0) // Historical behavior (see QString::indexOf and co.)
        from += haystack.size();
    if (from >= haystack.size())
        return -1;

    const auto start = [haystack] {
        if constexpr (std::is_same_v<String, QStringView>)
            return haystack.utf16();
        else
            return haystack.begin();
    }();

    auto begin = start + from;
    auto end = start + haystack.size();
    auto found = begin;
    if (m_cs == Qt::CaseSensitive) {
        found = m_caseSensitiveSearcher(begin, end, m_pattern.begin(), m_pattern.end()).begin;
        if (found == end)
            return -1;
    } else {
        const qsizetype bufferSize = std::min(m_pattern.size(), qsizetype(sizeof m_foldBuffer));
        const QLatin1StringView restNeedle = m_pattern.sliced(bufferSize);
        const bool needleLongerThanBuffer = restNeedle.size() > 0;
        String restHaystack = haystack;
        do {
            found = m_caseInsensitiveSearcher(found, end, m_foldBuffer, &m_foldBuffer[bufferSize])
                            .begin;
            if (found == end) {
                return -1;
            } else if (!needleLongerThanBuffer) {
                break;
            }
            restHaystack = haystack.sliced(
                    qMin(haystack.size(),
                         bufferSize + qsizetype(std::distance(start, found))));
            if (restHaystack.startsWith(restNeedle, Qt::CaseInsensitive))
                break;
            ++found;
        } while (true);
    }
    return std::distance(start, found);
}